

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O1

void __thiscall QTextEdit::QTextEdit(QTextEdit *this,QWidget *parent)

{
  QTextEditPrivate *this_00;
  long in_FS_OFFSET;
  QArrayData *local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTextEditPrivate *)operator_new(0x3c8);
  QTextEditPrivate::QTextEditPrivate(this_00);
  QAbstractScrollArea::QAbstractScrollArea
            ((QAbstractScrollArea *)this,(QAbstractScrollAreaPrivate *)this_00,parent);
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_0080ac90;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QTextEdit_0080ae90;
  local_38 = (QArrayData *)0x0;
  uStack_30 = 0;
  local_28 = 0;
  QTextEditPrivate::init
            (*(QTextEditPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)&local_38);
  if (local_38 != (QArrayData *)0x0) {
    LOCK();
    (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextEdit::QTextEdit(QWidget *parent)
    : QAbstractScrollArea(*new QTextEditPrivate, parent)
{
    Q_D(QTextEdit);
    d->init();
}